

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O0

errr init_x11(wchar_t argc,char **argv)

{
  Pixell PVar1;
  Pixell bg;
  _Bool _Var2;
  errr eVar3;
  wchar_t wVar4;
  int iVar5;
  uint32_t uVar6;
  ushort **ppuVar7;
  char *pcVar8;
  infoclr *piVar9;
  ulong fg;
  Pixell local_488;
  wchar_t local_464;
  term_data *td;
  Pixell backpixel;
  Pixell pixel;
  wchar_t val;
  char *str;
  char buf [1024];
  ang_file *fff;
  char *pcStack_28;
  wchar_t num_term;
  char *dpy_name;
  wchar_t i;
  char **argv_local;
  wchar_t argc_local;
  
  pcStack_28 = "";
  fff._4_4_ = L'\xffffffff';
  for (dpy_name._4_4_ = L'\x01'; dpy_name._4_4_ < argc; dpy_name._4_4_ = dpy_name._4_4_ + L'\x01') {
    _Var2 = prefix(argv[dpy_name._4_4_],"-d");
    if (_Var2) {
      pcStack_28 = argv[dpy_name._4_4_] + 2;
    }
    else {
      _Var2 = prefix(argv[dpy_name._4_4_],"-n");
      if (_Var2) {
        fff._4_4_ = atoi(argv[dpy_name._4_4_] + 2);
        if (fff._4_4_ < L'\t') {
          if (fff._4_4_ < L'\x01') {
            fff._4_4_ = L'\x01';
          }
        }
        else {
          fff._4_4_ = L'\b';
        }
      }
      else {
        _Var2 = prefix(argv[dpy_name._4_4_],"-x");
        if (_Var2) {
          x11_prefs = argv[dpy_name._4_4_] + 2;
        }
        else {
          plog_fmt("Ignoring option: %s",argv[dpy_name._4_4_]);
        }
      }
    }
  }
  if (fff._4_4_ == L'\xffffffff') {
    fff._4_4_ = L'\x01';
    path_build(settings,0x400,ANGBAND_DIR_USER,"x11-settings.prf");
    buf._1016_8_ = file_open(settings,MODE_READ,FTYPE_TEXT);
    if ((ang_file *)buf._1016_8_ != (ang_file *)0x0) {
      while (_Var2 = file_getl((ang_file *)buf._1016_8_,(char *)&str,0x400), _Var2) {
        if (((((byte)str != 0) &&
             (ppuVar7 = __ctype_b_loc(), ((*ppuVar7)[(int)(uint)(byte)str] & 0x2000) == 0)) &&
            ((byte)str != 0x23)) && (_Var2 = prefix((char *)&str,"TERM_WINS"), _Var2)) {
          pcVar8 = strstr((char *)&str,"=");
          if (pcVar8 == (char *)0x0) {
            local_464 = L'\xffffffff';
          }
          else {
            local_464 = atoi(pcVar8 + 1);
          }
          if (L'\0' < local_464) {
            fff._4_4_ = local_464;
          }
        }
      }
      file_close((ang_file *)buf._1016_8_);
    }
  }
  eVar3 = Metadpy_init_2((Display *)0x0,pcStack_28);
  if (eVar3 == 0) {
    term_windows_open = fff._4_4_;
    xor = (infoclr *)mem_zalloc(0x20);
    PVar1 = Metadpy->fg;
    bg = Metadpy->bg;
    Infoclr = xor;
    wVar4 = Infoclr_Opcode("xor");
    Infoclr_init_data(PVar1,bg,wVar4,L'\0');
    for (dpy_name._4_4_ = 0; dpy_name._4_4_ < 0x60; dpy_name._4_4_ = dpy_name._4_4_ + 1) {
      piVar9 = (infoclr *)mem_zalloc(0x20);
      clr[dpy_name._4_4_] = piVar9;
      Infoclr = clr[dpy_name._4_4_];
      color_table_x11[dpy_name._4_4_ % 0x20][0] = angband_color_table[dpy_name._4_4_ % 0x20][0];
      color_table_x11[dpy_name._4_4_ % 0x20][1] = angband_color_table[dpy_name._4_4_ % 0x20][1];
      color_table_x11[dpy_name._4_4_ % 0x20][2] = angband_color_table[dpy_name._4_4_ % 0x20][2];
      color_table_x11[dpy_name._4_4_ % 0x20][3] = angband_color_table[dpy_name._4_4_ % 0x20][3];
      if (dpy_name._4_4_ == 0) {
        local_488 = Metadpy->bg;
      }
      else {
        local_488 = Metadpy->fg;
      }
      if (((byte)Metadpy->field_0x68 >> 1 & 1) == 0) {
        PVar1 = Metadpy->bg;
        wVar4 = Infoclr_Opcode("cpy");
        Infoclr_init_data(local_488,PVar1,wVar4,L'\0');
      }
      else {
        iVar5 = dpy_name._4_4_ % 0x20;
        uVar6 = create_pixel(Metadpy->dpy,color_table_x11[iVar5][1],color_table_x11[iVar5][2],
                             color_table_x11[iVar5][3]);
        fg = (ulong)uVar6;
        iVar5 = dpy_name._4_4_;
        if (dpy_name._4_4_ < 0) {
          iVar5 = dpy_name._4_4_ + 0x1f;
        }
        iVar5 = iVar5 >> 5;
        if (iVar5 == 0) {
          PVar1 = Metadpy->bg;
          wVar4 = Infoclr_Opcode("cpy");
          Infoclr_init_data(fg,PVar1,wVar4,L'\0');
        }
        else if (iVar5 == 1) {
          uVar6 = create_pixel(Metadpy->dpy,color_table_x11[dpy_name._4_4_ % 0x20][1],
                               color_table_x11[dpy_name._4_4_ % 0x20][2],
                               color_table_x11[dpy_name._4_4_ % 0x20][3]);
          wVar4 = Infoclr_Opcode("cpy");
          Infoclr_init_data(fg,(ulong)uVar6,wVar4,L'\0');
        }
        else if (iVar5 == 2) {
          uVar6 = create_pixel(Metadpy->dpy,color_table_x11[0x1c][1],color_table_x11[0x1c][2],
                               color_table_x11[0x1c][3]);
          wVar4 = Infoclr_Opcode("cpy");
          Infoclr_init_data(fg,(ulong)uVar6,wVar4,L'\0');
        }
      }
    }
    for (dpy_name._4_4_ = L'\0'; dpy_name._4_4_ < fff._4_4_;
        dpy_name._4_4_ = dpy_name._4_4_ + L'\x01') {
      term_data_init(data + dpy_name._4_4_,dpy_name._4_4_);
      angband_term[dpy_name._4_4_] = Term;
    }
    Infowin = data[0].win;
    Infowin_raise();
    Term_activate(&data[0].t);
    quit_aux = hook_quit;
    argv_local._4_4_ = 0;
  }
  else {
    argv_local._4_4_ = -1;
  }
  return argv_local._4_4_;
}

Assistant:

errr init_x11(int argc, char **argv)
{
	int i;

	const char *dpy_name = "";

	int num_term = -1;

	ang_file *fff;

	char buf[1024];
	const char *str;
	int val;

	/* Parse args */
	for (i = 1; i < argc; i++) {
		if (prefix(argv[i], "-d"))
		{
			dpy_name = &argv[i][2];
			continue;
		}

		if (prefix(argv[i], "-n")) {
			num_term = atoi(&argv[i][2]);
			if (num_term > MAX_TERM_DATA) num_term = MAX_TERM_DATA;
			else if (num_term < 1) num_term = 1;
			continue;
		}

		if (prefix(argv[i], "-x")) {
			x11_prefs = argv[i] + 2;
			continue;
		}

		plog_fmt("Ignoring option: %s", argv[i]);
	}


	if (num_term == -1) {
		num_term = 1;

		/* Build the filename */
		(void)path_build(settings, sizeof(settings), ANGBAND_DIR_USER,
						 "x11-settings.prf");

		/* Open the file */
		fff = file_open(settings, MODE_READ, FTYPE_TEXT);

		/* File exists */
		if (fff) {
			/* Process the file */
			while (file_getl(fff, buf, sizeof(buf))) {
				/* Skip "empty" lines */
				if (!buf[0]) continue;
	
				/* Skip "blank" lines */
				if (isspace((unsigned char)buf[0])) continue;
	
				/* Skip comments */
				if (buf[0] == '#') continue;
	
				/* Number of terminal windows */
				if (prefix(buf, "TERM_WINS")) {
					str = strstr(buf, "=");
					val = (str != NULL) ? atoi(str + 1) : -1;
					if (val > 0) num_term = val;
					continue;
				}
			}
	
			/* Close */
			(void)file_close(fff);
		}
	}


	/* Init the Metadpy if possible */
	if (Metadpy_init_name(dpy_name)) return (-1);

	/* Remember the number of terminal windows */
	term_windows_open = num_term;

	/* Prepare cursor color */
	xor = mem_zalloc(sizeof(infoclr));
	Infoclr_set(xor);
	Infoclr_init_ppn(Metadpy->fg, Metadpy->bg, "xor", 0);


	/* Prepare normal colors */
	for (i = 0; i < MAX_COLORS * BG_MAX; ++i) {
		Pixell pixel;

		clr[i] = mem_zalloc(sizeof(infoclr));

		Infoclr_set(clr[i]);

		/* Acquire Angband colors */
		color_table_x11[i % MAX_COLORS][0] =
			angband_color_table[i % MAX_COLORS][0];
		color_table_x11[i % MAX_COLORS][1] =
			angband_color_table[i % MAX_COLORS][1];
		color_table_x11[i % MAX_COLORS][2] =
			angband_color_table[i % MAX_COLORS][2];
		color_table_x11[i % MAX_COLORS][3] =
			angband_color_table[i % MAX_COLORS][3];

		/* Default to monochrome */
		pixel = ((i == 0) ? Metadpy->bg : Metadpy->fg);

		/* Handle color 
		   This block of code has added support for background colours
                   (from Sil) */
		if (Metadpy->color) {
			Pixell backpixel;
			/* Create pixel */
			pixel = create_pixel(Metadpy->dpy,
					     color_table_x11[i % MAX_COLORS][1],
					     color_table_x11[i % MAX_COLORS][2],
					     color_table_x11[i % MAX_COLORS][3]);
			switch (i / MAX_COLORS)
			{
				case BG_BLACK:
					/* Default Background */
					Infoclr_init_ppn(pixel, Metadpy->bg, "cpy", 0);
					break;
				case BG_SAME:
					/* Background same as foreground */
					backpixel = create_pixel(Metadpy->dpy,
											 color_table_x11[i % MAX_COLORS][1],
											 color_table_x11[i % MAX_COLORS][2],
											 color_table_x11[i % MAX_COLORS][3]);
					Infoclr_init_ppn(pixel, backpixel, "cpy", 0);
					break;
				case BG_DARK:
					/* Highlight Background */
					backpixel = create_pixel(Metadpy->dpy,
											 color_table_x11[COLOUR_SHADE][1],
											 color_table_x11[COLOUR_SHADE][2],
											 color_table_x11[COLOUR_SHADE][3]);
					Infoclr_init_ppn(pixel, backpixel, "cpy", 0);
					break;
			}
		} else {
			/* Handle monochrome */
		    Infoclr_init_ppn(pixel, Metadpy->bg, "cpy", 0);
		}
	}


	/* Initialize the windows */
	for (i = 0; i < num_term; i++) {
		term_data *td = &data[i];

		/* Initialize the term_data */
		term_data_init(td, i);

		/* Save global entry */
		angband_term[i] = Term;
	}

	/* Raise the "Angband" window */
	Infowin_set(data[0].win);
	Infowin_raise();

	/* Activate the "Angband" window screen */
	Term_activate(&data[0].t);


	/* Activate hook */
	quit_aux = hook_quit;

	/* Success */
	return (0);
}